

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O0

void CorUnix::CPalSynchronizationManager::ReleaseLocalSynchLock(CPalThread *pthrCurrent)

{
  int iVar1;
  Volatile *this;
  CPalThread *pthrCurrent_local;
  
  iVar1 = ::Volatile::operator_cast_to_int
                    ((Volatile *)&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount);
  if (iVar1 < 1) {
    fprintf(_stderr,"] %s %s:%d","ReleaseLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x277);
    fprintf(_stderr,"Expression: 0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount\n");
  }
  this = (Volatile *)
         Volatile<int>::operator--(&(pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount);
  iVar1 = ::Volatile::operator_cast_to_int(this);
  if (iVar1 == 0) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
    CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
              (&pthrCurrent->synchronizationInfo);
  }
  return;
}

Assistant:

static void ReleaseLocalSynchLock(CPalThread * pthrCurrent) 
        {
            _ASSERTE(0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount);
            if (0 == --pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount)
            {
                InternalLeaveCriticalSection(pthrCurrent, &s_csSynchProcessLock);
                
#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
                pthrCurrent->synchronizationInfo.RunDeferredThreadConditionSignalings();
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            }
        }